

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

void list_insert_ordered(AD *ad,AD **list,_func_Boolean_AD_ptr_AD_ptr *pred)

{
  AD *pAVar1;
  _AD **pp_Var2;
  AD *pAVar3;
  
  if (ma_hfree == (AD *)0x0) {
    ad->next = (_AD *)0x0;
    ma_hfree = ad;
    return;
  }
  pAVar1 = (AD *)0x0;
  pAVar3 = ma_hfree;
  while( true ) {
    if (pAVar3 == (AD *)0x0) {
      pAVar1->next = ad;
      ad->next = (_AD *)0x0;
      return;
    }
    if (ad < pAVar3) break;
    pAVar1 = pAVar3;
    pAVar3 = pAVar3->next;
  }
  pp_Var2 = &ma_hfree;
  if (pAVar1 != (AD *)0x0) {
    pp_Var2 = &pAVar1->next;
  }
  *pp_Var2 = ad;
  ad->next = pAVar3;
  return;
}

Assistant:

private void list_insert_ordered(ad, list, pred)
    AD        *ad;        /* the AD to insert */
    AD        **list;        /* the list to insert into */
    Boolean    (*pred)(AD *, AD *);    /* predicate */
{
    AD        *ad1;        /* lead traversal pointer */
    AD        *ad2;        /* trailing traversal pointer */

    if (*list == (AD *)NULL)
    {
        /* empty list */
        ad->next = (AD *)NULL;
        *list = ad;
        return;
    }

    /* list has at least one element */
    for (ad2 = (AD *)NULL, ad1 = *list; ad1; ad2 = ad1, ad1 = ad1->next)
    {
        /* does ad1 match? */
        if ((*pred)(ad, ad1))
        {
            /* yes; insert ad before ad1 */
            if (ad2)
            {
                /* ad1 is second or later element */
                ad2->next = ad;
            }
            else
            {
                /* ad1 is first element */
                *list = ad;
            }
            ad->next = ad1;

            /* success */
            return;
        }
    }

    /* append ad to list */
    ad2->next = ad;
    ad->next = (AD *)NULL;
}